

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

QPlatformTextureList * widgetTexturesFor(QWidget *tlw,QWidget *widget)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  QTLWExtra *pQVar4;
  QWidget *pQVar5;
  QPlatformTextureList *pQVar6;
  int iVar7;
  pointer puVar8;
  
  pQVar4 = QWidgetPrivate::topData(*(QWidgetPrivate **)&tlw->field_0x8);
  puVar8 = (pQVar4->widgetTextures).
           super__Vector_base<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pQVar4->widgetTextures).
           super__Vector_base<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar8 == puVar1) {
      if (((*(byte *)(*(long *)&widget->field_0x8 + 0x253) & 2) != 0) &&
         (-2 < (char)QtGlobalStatic::
                     Holder<(anonymous_namespace)::Q_QGS_qt_dummy_platformTextureList>::guard.
                     _q_value.super___atomic_base<signed_char>._M_i)) {
        pQVar6 = (QPlatformTextureList *)
                 QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dummy_platformTextureList>_>
                 ::instance();
        return pQVar6;
      }
      return (QPlatformTextureList *)0x0;
    }
    for (iVar7 = 0; iVar3 = QPlatformTextureList::count(), iVar7 < iVar3; iVar7 = iVar7 + 1) {
      pQVar5 = (QWidget *)
               QPlatformTextureList::source
                         ((int)(puVar8->_M_t).
                               super___uniq_ptr_impl<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPlatformTextureList_*,_std::default_delete<QPlatformTextureList>_>
                               .super__Head_base<0UL,_QPlatformTextureList_*,_false>._M_head_impl);
      bVar2 = hasPlatformWindow(pQVar5);
      if ((bVar2 && pQVar5 == widget) ||
         ((bVar2 = hasPlatformWindow(pQVar5), !bVar2 &&
          (pQVar5 = QWidget::nativeParentWidget(pQVar5), pQVar5 == widget)))) {
        return (puVar8->_M_t).
               super___uniq_ptr_impl<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>
               ._M_t.
               super__Tuple_impl<0UL,_QPlatformTextureList_*,_std::default_delete<QPlatformTextureList>_>
               .super__Head_base<0UL,_QPlatformTextureList_*,_false>._M_head_impl;
      }
    }
    puVar8 = puVar8 + 1;
  } while( true );
}

Assistant:

static QPlatformTextureList *widgetTexturesFor(QWidget *tlw, QWidget *widget)
{
    for (const auto &tl : QWidgetPrivate::get(tlw)->topData()->widgetTextures) {
        Q_ASSERT(!tl->isEmpty());
        for (int i = 0; i < tl->count(); ++i) {
            QWidget *w = static_cast<QWidget *>(tl->source(i));
            if ((hasPlatformWindow(w) && w == widget) || (!hasPlatformWindow(w) && w->nativeParentWidget() == widget))
                return tl.get();
        }
    }

    if (QWidgetPrivate::get(widget)->textureChildSeen)
        return qt_dummy_platformTextureList();

    return nullptr;
}